

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::TrackPid(ScriptContext *this,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  PropertyRecord *propertyRecord;
  undefined4 *puVar3;
  
  if (propertyId < 0x2d9) {
    return;
  }
  propertyRecord = ThreadContext::GetPropertyName(this->threadContext,propertyId);
  if (propertyRecord == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x669,"(propertyRecord != nullptr)","propertyRecord != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    propertyRecord = (PropertyRecord *)0x0;
  }
  TrackPid(this,propertyRecord);
  return;
}

Assistant:

void ScriptContext::TrackPid(PropertyId propertyId)
    {
        if (IsBuiltInPropertyId(propertyId))
        {
            return;
        }
        const PropertyRecord* propertyRecord = this->GetPropertyName(propertyId);
        Assert(propertyRecord != nullptr);
        this->TrackPid(propertyRecord);
    }